

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_module **ppsVar1;
  int iVar2;
  sqlite3_vtab *psVar3;
  sqlite3_module *psVar4;
  sqlite3_vtab *psVar5;
  char *pcVar6;
  u8 *a;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iOff;
  i64 iPos;
  int local_44;
  Fts5Buffer *local_40;
  Fts5IndexIter *local_38;
  
  psVar3 = pCursor->pVtab;
  local_44 = 0;
  psVar4 = pCursor[2].pVtab[1].pModule;
  iVar2 = *(int *)&psVar4->xBestIndex;
  lVar14 = (long)iVar2;
  pCursor[10].pVtab = (sqlite3_vtab *)((long)&(pCursor[10].pVtab)->pModule + 1);
  iVar7 = psVar3[2].nRef;
  if (iVar7 == 0) {
    uVar10 = (ulong)*(int *)&pCursor[7].pVtab;
    iVar12 = *(int *)&pCursor[7].pVtab + 1;
    uVar13 = uVar10;
    if (iVar12 < iVar2) {
      iVar12 = iVar2;
    }
    do {
      if (lVar14 <= (long)(uVar13 + 1)) {
        *(int *)&pCursor[7].pVtab = iVar12;
        goto LAB_001c40c5;
      }
      uVar8 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar8;
      lVar11 = uVar13 * 2;
      uVar13 = uVar13 + 1;
    } while (*(long *)(&(pCursor[9].pVtab)->nRef + lVar11) == 0);
    *(uint *)&pCursor[7].pVtab = uVar8;
    if ((int)uVar8 < iVar2) goto LAB_001c40d6;
  }
  else if (iVar7 == 2) {
    iVar2 = *(int *)((long)&psVar4->xColumn + 4);
    psVar3 = pCursor[4].pVtab;
    do {
      if ((iVar2 != 1) &&
         (iVar7 = sqlite3Fts5PoslistNext64
                            (*(u8 **)&psVar3->nRef,*(int *)&psVar3->zErrMsg,(int *)(pCursor + 0xe),
                             (i64 *)(pCursor + 0xd)), iVar7 == 0)) {
        return 0;
      }
      pCursor[0xd].pVtab = (sqlite3_vtab *)0x0;
      *(undefined4 *)&pCursor[0xe].pVtab = 0;
      iVar7 = sqlite3Fts5IterNextScan((Fts5IndexIter *)pCursor[4].pVtab);
      if (iVar7 != 0) break;
      iVar7 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor);
      if (iVar2 == 1) {
        return iVar7;
      }
      if (*(int *)&pCursor[3].pVtab != 0) {
        return iVar7;
      }
    } while (iVar7 == 0);
    *(undefined4 *)&pCursor[3].pVtab = 1;
    return iVar7;
  }
LAB_001c40c5:
  psVar5 = pCursor[4].pVtab;
  if (*(char *)((long)&psVar5->zErrMsg + 4) == '\0') {
    pcVar6 = psVar5[(ulong)*(ushort *)(psVar5[3].zErrMsg + 4) * 5 + 7].zErrMsg;
    iVar12 = *(int *)&psVar5[(ulong)*(ushort *)(psVar5[3].zErrMsg + 4) * 5 + 8].pModule + -1;
    iVar7 = *(int *)&pCursor[5].pVtab;
    if (-1 < iVar7) {
      iVar9 = iVar7;
      if (iVar12 < iVar7) {
        iVar9 = iVar12;
      }
      iVar9 = memcmp(pCursor[6].pVtab,pcVar6 + 1,(long)iVar9);
      if ((iVar9 < 0) || (iVar7 < iVar12 && iVar9 == 0)) {
        *(undefined4 *)&pCursor[3].pVtab = 1;
        return 0;
      }
    }
    sqlite3Fts5BufferSet(&local_44,(Fts5Buffer *)(pCursor + 0xb),iVar12,(u8 *)(pcVar6 + 1));
    memset(pCursor[8].pVtab,0,lVar14 * 8);
    memset(pCursor[9].pVtab,0,lVar14 * 8);
    *(undefined4 *)&pCursor[7].pVtab = 0;
    if (local_44 != 0) {
      return local_44;
    }
    iVar7 = psVar3[2].nRef;
    local_40 = (Fts5Buffer *)(pCursor + 0xb);
    do {
      iVar12 = *(int *)((long)&(pCursor[2].pVtab[1].pModule)->xColumn + 4);
      iPos = 0;
      iOff = 0;
      local_38 = (Fts5IndexIter *)pCursor[4].pVtab;
      a = local_38->pData;
      iVar9 = local_38->nData;
      if (iVar7 == 0) {
        if (iVar12 == 0) {
          uVar13 = 0xffffffffffffffff;
          while (iVar7 = sqlite3Fts5PoslistNext64(a,iVar9,&iOff,&iPos), iVar7 == 0) {
            iVar7 = (int)((ulong)iPos >> 0x20);
            if ((int)uVar13 != iVar7) {
              if (iVar2 <= iVar7) {
                return 0x10b;
              }
              ppsVar1 = &(pCursor[9].pVtab)->pModule + (iPos >> 0x20);
              *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
              uVar13 = (ulong)iPos >> 0x20;
            }
            ppsVar1 = &(pCursor[8].pVtab)->pModule + (iPos >> 0x20);
            *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
          }
        }
        else {
          if (iVar12 != 2) goto LAB_001c4262;
          while (iVar7 = sqlite3Fts5PoslistNext64(a,iVar9,&iOff,&iPos), iVar7 == 0) {
            if (lVar14 <= iPos) {
              return 0x10b;
            }
            ppsVar1 = &(pCursor[9].pVtab)->pModule + iPos;
            *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
          }
        }
      }
      else if (iVar7 == 1) {
        if (iVar12 == 0) {
          while (iVar7 = sqlite3Fts5PoslistNext64(a,iVar9,&iOff,&iPos), iVar7 == 0) {
            (pCursor[8].pVtab)->pModule =
                 (sqlite3_module *)((long)&(pCursor[8].pVtab)->pModule->iVersion + 1);
          }
        }
LAB_001c4262:
        (pCursor[9].pVtab)->pModule =
             (sqlite3_module *)((long)&(pCursor[9].pVtab)->pModule->iVersion + 1);
      }
      iVar12 = sqlite3Fts5IterNextScan(local_38);
      iVar7 = psVar3[2].nRef;
      if (iVar7 == 2) {
        if (iVar12 != 0) {
          return iVar12;
        }
        iVar7 = 2;
        goto LAB_001c40d6;
      }
      if (iVar12 != 0) {
        return iVar12;
      }
      psVar5 = pCursor[4].pVtab;
      uVar8 = *(int *)&psVar5[(ulong)*(ushort *)(psVar5[3].zErrMsg + 4) * 5 + 8].pModule - 1;
      if ((uVar8 != *(uint *)&pCursor[0xc].pVtab) ||
         (((1 < *(int *)&psVar5[(ulong)*(ushort *)(psVar5[3].zErrMsg + 4) * 5 + 8].pModule &&
           (iVar12 = bcmp(psVar5[(ulong)*(ushort *)(psVar5[3].zErrMsg + 4) * 5 + 7].zErrMsg + 1,
                          local_40->p,(ulong)uVar8), iVar12 != 0)) ||
          (*(char *)((long)&psVar5->zErrMsg + 4) != '\0')))) goto LAB_001c40d6;
    } while( true );
  }
  *(undefined4 *)&pCursor[3].pVtab = 1;
LAB_001c40d6:
  if (iVar7 != 0 || *(int *)&pCursor[3].pVtab != 0) {
    return 0;
  }
  iVar7 = *(int *)&pCursor[7].pVtab;
  lVar11 = (long)iVar7;
  iVar12 = iVar2;
  if (iVar2 < iVar7) {
    iVar12 = iVar7;
  }
  for (; (iVar7 = iVar12, lVar11 < lVar14 &&
         (iVar7 = (int)lVar11, (&(pCursor[9].pVtab)->pModule)[lVar11] == (sqlite3_module *)0x0));
      lVar11 = lVar11 + 1) {
    *(int *)&pCursor[7].pVtab = iVar7 + 1;
  }
  if (iVar7 != iVar2) {
    return 0;
  }
  return 0x10b;
}

Assistant:

static int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  int rc = SQLITE_OK;
  int nCol = pCsr->pFts5->pConfig->nCol;

  pCsr->rowid++;

  if( pTab->eType==FTS5_VOCAB_INSTANCE ){
    return fts5VocabInstanceNext(pCsr);
  }

  if( pTab->eType==FTS5_VOCAB_COL ){
    for(pCsr->iCol++; pCsr->iCol<nCol; pCsr->iCol++){
      if( pCsr->aDoc[pCsr->iCol] ) break;
    }
  }

  if( pTab->eType!=FTS5_VOCAB_COL || pCsr->iCol>=nCol ){
    if( sqlite3Fts5IterEof(pCsr->pIter) ){
      pCsr->bEof = 1;
    }else{
      const char *zTerm;
      int nTerm;

      zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
      assert( nTerm>=0 );
      if( pCsr->nLeTerm>=0 ){
        int nCmp = MIN(nTerm, pCsr->nLeTerm);
        int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
        if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
          pCsr->bEof = 1;
          return SQLITE_OK;
        }
      }

      sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
      memset(pCsr->aCnt, 0, nCol * sizeof(i64));
      memset(pCsr->aDoc, 0, nCol * sizeof(i64));
      pCsr->iCol = 0;

      assert( pTab->eType==FTS5_VOCAB_COL || pTab->eType==FTS5_VOCAB_ROW );
      while( rc==SQLITE_OK ){
        int eDetail = pCsr->pFts5->pConfig->eDetail;
        const u8 *pPos; int nPos;   /* Position list */
        i64 iPos = 0;               /* 64-bit position read from poslist */
        int iOff = 0;               /* Current offset within position list */

        pPos = pCsr->pIter->pData;
        nPos = pCsr->pIter->nData;

        switch( pTab->eType ){
          case FTS5_VOCAB_ROW:
            if( eDetail==FTS5_DETAIL_FULL ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                pCsr->aCnt[0]++;
              }
            }
            pCsr->aDoc[0]++;
            break;

          case FTS5_VOCAB_COL:
            if( eDetail==FTS5_DETAIL_FULL ){
              int iCol = -1;
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                int ii = FTS5_POS2COLUMN(iPos);
                if( iCol!=ii ){
                  if( ii>=nCol ){
                    rc = FTS5_CORRUPT;
                    break;
                  }
                  pCsr->aDoc[ii]++;
                  iCol = ii;
                }
                pCsr->aCnt[ii]++;
              }
            }else if( eDetail==FTS5_DETAIL_COLUMNS ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff,&iPos) ){
                assert_nc( iPos>=0 && iPos<nCol );
                if( iPos>=nCol ){
                  rc = FTS5_CORRUPT;
                  break;
                }
                pCsr->aDoc[iPos]++;
              }
            }else{
              assert( eDetail==FTS5_DETAIL_NONE );
              pCsr->aDoc[0]++;
            }
            break;

          default:
            assert( pTab->eType==FTS5_VOCAB_INSTANCE );
            break;
        }

        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5IterNextScan(pCsr->pIter);
        }
        if( pTab->eType==FTS5_VOCAB_INSTANCE ) break;

        if( rc==SQLITE_OK ){
          zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
          if( nTerm!=pCsr->term.n 
          || (nTerm>0 && memcmp(zTerm, pCsr->term.p, nTerm)) 
          ){
            break;
          }
          if( sqlite3Fts5IterEof(pCsr->pIter) ) break;
        }
      }
    }
  }

  if( rc==SQLITE_OK && pCsr->bEof==0 && pTab->eType==FTS5_VOCAB_COL ){
    for(/* noop */; pCsr->iCol<nCol && pCsr->aDoc[pCsr->iCol]==0; pCsr->iCol++);
    if( pCsr->iCol==nCol ){
      rc = FTS5_CORRUPT;
    }
  }
  return rc;
}